

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * sqlite3GetCollSeq(Parse *pParse,u8 enc,CollSeq *pColl,char *zName)

{
  int iVar1;
  sqlite3 *in_RCX;
  sqlite3 *in_RDX;
  undefined1 in_SIL;
  Parse *in_RDI;
  sqlite3 *db;
  CollSeq *p;
  int in_stack_ffffffffffffffcc;
  sqlite3 *zName_00;
  sqlite3 *db_00;
  undefined7 in_stack_fffffffffffffff0;
  
  zName_00 = in_RDI->db;
  db_00 = in_RDX;
  if (in_RDX == (sqlite3 *)0x0) {
    in_RDX = (sqlite3 *)sqlite3FindCollSeq(in_RCX,'\0',(char *)zName_00,in_stack_ffffffffffffffcc);
  }
  if ((in_RDX == (sqlite3 *)0x0) || (in_RDX->mutex == (sqlite3_mutex *)0x0)) {
    callCollNeeded((sqlite3 *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),(int)((ulong)db_00 >> 0x20)
                   ,(char *)in_RCX);
    in_RDX = (sqlite3 *)
             sqlite3FindCollSeq(in_RCX,(u8)((ulong)in_RDX >> 0x38),(char *)zName_00,
                                in_stack_ffffffffffffffcc);
  }
  if ((in_RDX != (sqlite3 *)0x0) && (in_RDX->mutex == (sqlite3_mutex *)0x0)) {
    iVar1 = synthCollSeq(db_00,(CollSeq *)in_RCX);
    if (iVar1 != 0) {
      in_RDX = (sqlite3 *)0x0;
    }
  }
  if (in_RDX == (sqlite3 *)0x0) {
    sqlite3ErrorMsg(in_RDI,"no such collation sequence: %s",in_RCX);
    in_RDI->rc = 0x101;
  }
  return (CollSeq *)in_RDX;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3GetCollSeq(
  Parse *pParse,        /* Parsing context */
  u8 enc,               /* The desired encoding for the collating sequence */
  CollSeq *pColl,       /* Collating sequence with native encoding, or NULL */
  const char *zName     /* Collating sequence name */
){
  CollSeq *p;
  sqlite3 *db = pParse->db;

  p = pColl;
  if( !p ){
    p = sqlite3FindCollSeq(db, enc, zName, 0);
  }
  if( !p || !p->xCmp ){
    /* No collation sequence of this type for this encoding is registered.
    ** Call the collation factory to see if it can supply us with one.
    */
    callCollNeeded(db, enc, zName);
    p = sqlite3FindCollSeq(db, enc, zName, 0);
  }
  if( p && !p->xCmp && synthCollSeq(db, p) ){
    p = 0;
  }
  assert( !p || p->xCmp );
  if( p==0 ){
    sqlite3ErrorMsg(pParse, "no such collation sequence: %s", zName);
    pParse->rc = SQLITE_ERROR_MISSING_COLLSEQ;
  }
  return p;
}